

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_msa_st_w_mips64el(CPUMIPSState_conflict5 *env,uint32_t wd,target_ulong addr)

{
  int mmu_idx_00;
  uint idx;
  TCGMemOpIdx oi_00;
  fpr_t *pfVar1;
  uintptr_t unaff_retaddr;
  TCGMemOpIdx oi;
  int mmu_idx;
  wr_t *pwd;
  target_ulong addr_local;
  uint32_t wd_local;
  CPUMIPSState_conflict5 *env_local;
  
  pfVar1 = (env->active_fpu).fpr + wd;
  mmu_idx_00 = cpu_mmu_index(env,false);
  idx = cpu_mmu_index(env,false);
  oi_00 = make_memop_idx(MO_AMASK|MO_32,idx);
  ensure_writable_pages(env,addr,mmu_idx_00,unaff_retaddr);
  helper_le_stl_mmu_mips64el((CPUArchState_conflict13 *)env,addr,pfVar1->w[0],oi_00,unaff_retaddr);
  helper_le_stl_mmu_mips64el
            ((CPUArchState_conflict13 *)env,addr + 4,pfVar1->w[1],oi_00,unaff_retaddr);
  helper_le_stl_mmu_mips64el
            ((CPUArchState_conflict13 *)env,addr + 8,pfVar1->w[2],oi_00,unaff_retaddr);
  helper_le_stl_mmu_mips64el
            ((CPUArchState_conflict13 *)env,addr + 0xc,pfVar1->w[3],oi_00,unaff_retaddr);
  return;
}

Assistant:

void helper_msa_st_w(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    int mmu_idx = cpu_mmu_index(env, false);

    MEMOP_IDX(DF_WORD)
    ensure_writable_pages(env, addr, mmu_idx, GETPC());
#if !defined(HOST_WORDS_BIGENDIAN)
    helper_ret_stl_mmu(env, addr + (0 << DF_WORD), pwd->w[0], oi, GETPC());
    helper_ret_stl_mmu(env, addr + (1 << DF_WORD), pwd->w[1], oi, GETPC());
    helper_ret_stl_mmu(env, addr + (2 << DF_WORD), pwd->w[2], oi, GETPC());
    helper_ret_stl_mmu(env, addr + (3 << DF_WORD), pwd->w[3], oi, GETPC());
#else
    helper_ret_stl_mmu(env, addr + (1 << DF_WORD), pwd->w[0], oi, GETPC());
    helper_ret_stl_mmu(env, addr + (0 << DF_WORD), pwd->w[1], oi, GETPC());
    helper_ret_stl_mmu(env, addr + (3 << DF_WORD), pwd->w[2], oi, GETPC());
    helper_ret_stl_mmu(env, addr + (2 << DF_WORD), pwd->w[3], oi, GETPC());
#endif
}